

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityIdentifier.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::EntityIdentifier::operator<(EntityIdentifier *this,EntityIdentifier *Value)

{
  uint6 uVar1;
  uint6 uVar2;
  
  uVar1._0_2_ = (this->super_SimulationIdentifier).m_ui16SiteID;
  uVar1._2_2_ = (this->super_SimulationIdentifier).m_ui16ApplicationID;
  uVar1._4_2_ = *(undefined2 *)&(this->super_SimulationIdentifier).field_0xc;
  uVar2._0_2_ = (Value->super_SimulationIdentifier).m_ui16SiteID;
  uVar2._2_2_ = (Value->super_SimulationIdentifier).m_ui16ApplicationID;
  uVar2._4_2_ = *(undefined2 *)&(Value->super_SimulationIdentifier).field_0xc;
  return (ulong)uVar1 < (ulong)uVar2;
}

Assistant:

KBOOL EntityIdentifier::operator <  ( const EntityIdentifier & Value ) const
{
    // We will bit shift all 3 fields into a single KUINT64, this will generate a new unique value which we can then use for comparison.
    // bits 0-15  = SiteID
    // bits 16-31 = ApplicationID
    // bits 32-47 = EntityID
    // bits 48-63 = 0
    KUINT64 ui64ThisCmpVal = 0, ui64OtherCmpVal = 0;

    ui64ThisCmpVal = m_ui16SiteID | ( KUINT64 )m_ui16ApplicationID << 16 | ( KUINT64 )m_ui16EntityID << 32;
    ui64OtherCmpVal = Value.m_ui16SiteID | ( KUINT64 )Value.m_ui16ApplicationID << 16 | ( KUINT64 )Value.m_ui16EntityID << 32;

    return ui64ThisCmpVal < ui64OtherCmpVal;
}